

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O1

void __thiscall Assimp::ASEImporter::BuildUniqueRepresentation(ASEImporter *this,Mesh *mesh)

{
  pointer paVar1;
  pointer paVar2;
  long lVar3;
  long lVar4;
  pointer paVar5;
  pointer pBVar6;
  void *pvVar7;
  float fVar8;
  float fVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  uint (*pauVar14) [3];
  uint n;
  ulong uVar15;
  long lVar16;
  pointer pFVar17;
  pointer paVar18;
  float fVar19;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> mNormals;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> mVertexColors;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> mPositions;
  vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_> mBoneVertices;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> amTexCoords [8];
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_198;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> local_178;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_158;
  vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_> local_138;
  ulong local_118;
  uint (*local_110) [3];
  ulong local_108;
  pointer local_100;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_f8 [8];
  
  local_158.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  memset(local_f8,0,0xc0);
  local_178.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar10 = (ulong)(uint)((int)((ulong)((long)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>
                                             ).mFaces.
                                             super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>)
                                            .mFaces.
                                            super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                        -0x45d1745d);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize(&local_158,uVar10);
  lVar16 = 0;
  do {
    if (*(long *)((long)&mesh->amTexCoords[0].
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar16) !=
        *(long *)((long)&mesh->amTexCoords[0].
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish + lVar16)) {
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                 ((long)&local_f8[0].
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar16),uVar10);
    }
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 0xc0);
  if ((mesh->mVertexColors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (mesh->mVertexColors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::resize(&local_178,uVar10);
  }
  if ((mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize(&local_198,uVar10);
  }
  if ((mesh->mBoneVertices).
      super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (mesh->mBoneVertices).
      super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>::resize
              (&local_138,uVar10);
  }
  pFVar17 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
            super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pFVar17 !=
      (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
      super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pauVar14 = pFVar17->amUVIndices;
    uVar10 = 0;
    uVar15 = 0;
    do {
      local_108 = (ulong)(uint)((int)uVar10 * 3);
      local_110 = pauVar14;
      lVar16 = 0;
      local_100 = pFVar17;
      local_118 = uVar10;
      do {
        paVar18 = local_198.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start;
        uVar12 = (pFVar17->super_FaceWithSmoothingGroup).mIndices[lVar16];
        paVar2 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_158.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_start[uVar15].z = *(float *)((long)(paVar2 + uVar12) + 8);
        paVar2 = paVar2 + uVar12;
        fVar19 = paVar2->y;
        local_158.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_start[uVar15].x = paVar2->x;
        local_158.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_start[uVar15].y = fVar19;
        lVar11 = 0;
        do {
          lVar3 = *(long *)((long)&mesh->amTexCoords[0].
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar11 * 2);
          if (lVar3 == *(long *)((long)&mesh->amTexCoords[0].
                                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish + lVar11 * 2))
          break;
          uVar10 = (ulong)*(uint *)((long)*pauVar14 + lVar11);
          lVar4 = *(long *)((long)&local_f8[0].
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar11 * 2);
          *(undefined4 *)(lVar4 + 8 + uVar15 * 0xc) = *(undefined4 *)(lVar3 + 8 + uVar10 * 0xc);
          *(undefined8 *)(lVar4 + uVar15 * 0xc) = *(undefined8 *)(lVar3 + uVar10 * 0xc);
          lVar11 = lVar11 + 0xc;
        } while (lVar11 != 0x60);
        paVar5 = (mesh->mVertexColors).
                 super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (paVar5 != (mesh->mVertexColors).
                      super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
          paVar5 = paVar5 + pFVar17->mColorIndices[lVar16];
          fVar19 = paVar5->g;
          fVar8 = paVar5->b;
          fVar9 = paVar5->a;
          paVar1 = local_178.
                   super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar15;
          paVar1->r = paVar5->r;
          paVar1->g = fVar19;
          paVar1->b = fVar8;
          paVar1->a = fVar9;
        }
        paVar2 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (paVar2 != (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
          uVar12 = (int)local_108 + (int)lVar16;
          local_198.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar15].z = paVar2[uVar12].z;
          fVar19 = paVar2[uVar12].y;
          local_198.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar15].x = paVar2[uVar12].x;
          local_198.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar15].y = fVar19;
          fVar19 = local_198.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar15].z *
                   local_198.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar15].z +
                   local_198.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar15].x *
                   local_198.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar15].x +
                   local_198.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar15].y *
                   local_198.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar15].y;
          if (fVar19 < 0.0) {
            fVar19 = sqrtf(fVar19);
          }
          else {
            fVar19 = SQRT(fVar19);
          }
          fVar19 = 1.0 / fVar19;
          paVar18 = paVar18 + uVar15;
          paVar18->x = paVar18->x * fVar19;
          paVar18->y = paVar18->y * fVar19;
          paVar18->z = fVar19 * paVar18->z;
          pFVar17 = local_100;
        }
        uVar10 = (ulong)(pFVar17->super_FaceWithSmoothingGroup).mIndices[lVar16];
        pBVar6 = (mesh->mBoneVertices).
                 super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar13 = ((long)(mesh->mBoneVertices).
                        super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar6 >> 3) *
                 -0x5555555555555555;
        if (uVar10 <= uVar13 && uVar13 - uVar10 != 0) {
          std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::operator=
                    (&local_138.
                      super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar15].mBoneWeights,
                     &pBVar6[uVar10].mBoneWeights);
        }
        (pFVar17->super_FaceWithSmoothingGroup).mIndices[lVar16] = (uint32_t)uVar15;
        lVar16 = lVar16 + 1;
        uVar15 = (ulong)((uint32_t)uVar15 + 1);
        pauVar14 = (uint (*) [3])(*pauVar14 + 1);
      } while (lVar16 != 3);
      pFVar17 = pFVar17 + 1;
      uVar10 = (ulong)((int)local_118 + 1);
      pauVar14 = local_110 + 0xb;
    } while (pFVar17 !=
             (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
             super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator=
            (&(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals,&local_198);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator=
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)mesh,&local_158);
  std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::operator=
            (&mesh->mVertexColors,&local_178);
  lVar16 = 0;
  do {
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator=
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
               ((long)&mesh->amTexCoords[0].
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar16),
               (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
               ((long)&local_f8[0].
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar16));
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 0xc0);
  std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>::~vector
            (&local_138);
  if (local_198.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_198.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_178.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.
                    super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_178.
                          super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.
                          super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  lVar16 = 0xc0;
  do {
    pvVar7 = *(void **)((long)&local_110 + lVar16);
    if (pvVar7 != (void *)0x0) {
      operator_delete(pvVar7,*(long *)((long)local_f8 + lVar16 + -8) - (long)pvVar7);
    }
    lVar16 = lVar16 + -0x18;
  } while (lVar16 != 0);
  if (local_158.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ASEImporter::BuildUniqueRepresentation(ASE::Mesh& mesh)    {
    // allocate output storage
    std::vector<aiVector3D> mPositions;
    std::vector<aiVector3D> amTexCoords[AI_MAX_NUMBER_OF_TEXTURECOORDS];
    std::vector<aiColor4D>  mVertexColors;
    std::vector<aiVector3D> mNormals;
    std::vector<BoneVertex> mBoneVertices;

    unsigned int iSize = (unsigned int)mesh.mFaces.size() * 3;
    mPositions.resize(iSize);

    // optional texture coordinates
    for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS;++i)    {
        if (!mesh.amTexCoords[i].empty())   {
            amTexCoords[i].resize(iSize);
        }
    }
    // optional vertex colors
    if (!mesh.mVertexColors.empty())    {
        mVertexColors.resize(iSize);
    }

    // optional vertex normals (vertex normals can simply be copied)
    if (!mesh.mNormals.empty()) {
        mNormals.resize(iSize);
    }
    // bone vertices. There is no need to change the bone list
    if (!mesh.mBoneVertices.empty())    {
        mBoneVertices.resize(iSize);
    }

    // iterate through all faces in the mesh
    unsigned int iCurrent = 0, fi = 0;
    for (std::vector<ASE::Face>::iterator i =  mesh.mFaces.begin();i != mesh.mFaces.end();++i,++fi) {
        for (unsigned int n = 0; n < 3;++n,++iCurrent)
        {
            mPositions[iCurrent] = mesh.mPositions[(*i).mIndices[n]];

            // add texture coordinates
            for (unsigned int c = 0; c < AI_MAX_NUMBER_OF_TEXTURECOORDS;++c)    {
                if (mesh.amTexCoords[c].empty())break;
                amTexCoords[c][iCurrent] = mesh.amTexCoords[c][(*i).amUVIndices[c][n]];
            }
            // add vertex colors
            if (!mesh.mVertexColors.empty())    {
                mVertexColors[iCurrent] = mesh.mVertexColors[(*i).mColorIndices[n]];
            }
            // add normal vectors
            if (!mesh.mNormals.empty()) {
                mNormals[iCurrent] = mesh.mNormals[fi*3+n];
                mNormals[iCurrent].Normalize();
            }

            // handle bone vertices
            if ((*i).mIndices[n] < mesh.mBoneVertices.size())   {
                // (sometimes this will cause bone verts to be duplicated
                //  however, I' quite sure Schrompf' JoinVerticesStep
                //  will fix that again ...)
                mBoneVertices[iCurrent] =  mesh.mBoneVertices[(*i).mIndices[n]];
            }
            (*i).mIndices[n] = iCurrent;
        }
    }

    // replace the old arrays
    mesh.mNormals = mNormals;
    mesh.mPositions = mPositions;
    mesh.mVertexColors = mVertexColors;

    for (unsigned int c = 0; c < AI_MAX_NUMBER_OF_TEXTURECOORDS;++c)
        mesh.amTexCoords[c] = amTexCoords[c];
}